

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# foreach.c
# Opt level: O0

rxc_sink * rxc_sink_foreach(_func_void_void_ptr *callback)

{
  rxc_sink_foreach *sink;
  _func_void_void_ptr *callback_local;
  
  callback_local = (_func_void_void_ptr *)malloc(0x18);
  if (callback_local == (_func_void_void_ptr *)0x0) {
    callback_local = (_func_void_void_ptr *)0x0;
  }
  else {
    *(_func_void_void_ptr **)(callback_local + 0x10) = callback;
    *(code **)callback_local = dealloc;
    *(code **)(callback_local + 8) = create_logic;
  }
  return (rxc_sink *)callback_local;
}

Assistant:

struct rxc_sink * rxc_sink_foreach(void (*callback)(void *element))
{
    struct rxc_sink_foreach *sink = malloc(sizeof(struct rxc_sink_foreach));

    if (!sink) {
        return NULL;
    }

    sink->callback = callback;
    sink->base.dealloc = dealloc;
    sink->base.create_logic = create_logic;

    return &sink->base;
}